

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.h
# Opt level: O0

PipelineRegressor * __thiscall CoreML::Specification::Model::mutable_pipelineregressor(Model *this)

{
  bool bVar1;
  PipelineRegressor *this_00;
  Model *this_local;
  
  bVar1 = has_pipelineregressor(this);
  if (!bVar1) {
    clear_Type(this);
    set_has_pipelineregressor(this);
    this_00 = (PipelineRegressor *)operator_new(0x20);
    PipelineRegressor::PipelineRegressor(this_00);
    (this->Type_).pipelineregressor_ = this_00;
  }
  return (PipelineRegressor *)(this->Type_).pipelineclassifier_;
}

Assistant:

inline ::CoreML::Specification::PipelineRegressor* Model::mutable_pipelineregressor() {
  if (!has_pipelineregressor()) {
    clear_Type();
    set_has_pipelineregressor();
    Type_.pipelineregressor_ = new ::CoreML::Specification::PipelineRegressor;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.Model.pipelineRegressor)
  return Type_.pipelineregressor_;
}